

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O1

void __thiscall
cfdcapi_script_TapscriptTreeFromWitness_Test::TestBody
          (cfdcapi_script_TapscriptTreeFromWitness_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *tapscript;
  char *internal_pubkey;
  char *witness_program;
  char *tree_str;
  int ret;
  char *leaf_hash;
  char *control_block;
  AssertionResult gtest_ar;
  uint8_t leaf_version;
  void *handle;
  void *tree_handle;
  int tmp_ret;
  AssertHelper local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  int local_74;
  AssertHelper local_70;
  AssertHelper local_68;
  string local_60;
  uint8_t local_39;
  AssertHelper local_38;
  void *local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  int local_14;
  
  local_30 = (void *)0x0;
  local_74 = CfdCreateHandle(&local_30);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_28.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_28,&local_74);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_28);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x186,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_1_ = local_30 != (void *)0x0;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 == (void *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_28,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x187,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                       (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_74 = CfdInitializeTaprootScriptTree(local_30,&local_28.ptr_);
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_74);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x18b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_74 == 0) {
    local_90.data_ = (AssertHelperData *)0x0;
    local_74 = CfdSetTapScriptByWitnessStack
                         (local_30,local_28.ptr_,
                          "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
                          ,"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
                          (char **)&local_90);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_a0,&local_74);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x192,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
        local_a0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_74 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
                 "internal_pubkey",
                 "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
                 (char *)local_90.data_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x196,pcVar2);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          local_a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_90.data_);
      local_90.data_ = (AssertHelperData *)0x0;
    }
    local_39 = '\0';
    local_a0.data_ = (AssertHelperData *)0x0;
    local_70.data_ = (AssertHelperData *)0x0;
    local_74 = CfdGetBaseTapLeaf(local_30,local_28.ptr_,&local_39,(char **)&local_a0,
                                 (char **)&local_70);
    local_88.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_88.ptr_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_74);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_88);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1a0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_88.ptr_ + 8))();
        }
        local_88.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_74 == 0) {
      local_88.ptr_._0_4_ = 0xc0;
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&local_60,"0xc0","leaf_version",(int *)&local_88,&local_39);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1a2,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
          local_88.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\"",
                 "tapscript","201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
                 (char *)local_a0.data_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1a5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
          local_88.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513\"","leaf_hash",
                 "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
                 (char *)local_70.data_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1a8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
          local_88.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_a0.data_);
      local_a0.data_ = (AssertHelperData *)0x0;
      CfdFreeStringBuffer((char *)local_70.data_);
      local_70.data_ = (AssertHelperData *)0x0;
    }
    local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.data_ = (AssertHelperData *)0x0;
    local_74 = CfdGetTaprootScriptTreeHash
                         (local_30,local_28.ptr_,
                          "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
                          (char **)&local_88,(char **)&local_70,(char **)&local_68);
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_80.ptr_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_74);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1b6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_74 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2\"",
                 "witness_program",
                 "3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",
                 (char *)local_88.ptr_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1ba,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
          local_80.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513\"","leaf_hash",
                 "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
                 (char *)local_70.data_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1bd,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
          local_80.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54\""
                 ,"control_block",
                 "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
                 ,(char *)local_68.data_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1c0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
          local_80.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_88.ptr_);
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      CfdFreeStringBuffer((char *)local_70.data_);
      local_70.data_ = (AssertHelperData *)0x0;
      CfdFreeStringBuffer((char *)local_68.data_);
      local_68.data_ = (AssertHelperData *)0x0;
    }
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_74 = CfdGetTaprootScriptTreeSrting(local_30,local_28.ptr_,(char **)&local_80);
    local_98.data_ = (AssertHelperData *)((ulong)local_98.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_98,&local_74);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1cb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_98.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        local_98.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_74 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}\""
                 ,"tree_str",
                 "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}"
                 ,(char *)local_80.ptr_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_98);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1cf,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_98.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
          local_98.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_80.ptr_);
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    local_14 = CfdFreeTaprootScriptTreeHandle(local_30,local_28.ptr_);
    local_98.data_ = local_98.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","tmp_ret",(CfdErrorCode *)&local_98,&local_14);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1d5,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_98.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        local_98.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_74 = CfdGetLastErrorCode(local_30);
  if (local_74 != 0) {
    local_90.data_ = (AssertHelperData *)0x0;
    local_74 = CfdGetLastErrorMessage(local_30,(char **)&local_90);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_a0,&local_74);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1dc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
        local_a0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_60,"\"\"","str_buffer","",(char *)local_90.data_);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1dd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
        local_a0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_90.data_);
  }
  local_74 = CfdFreeHandle(local_30);
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_74);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_90.data_ + 8))();
      }
      local_90.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeFromWitness) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    char* internal_pubkey = nullptr;
    ret = CfdSetTapScriptByWitnessStack(handle, tree_handle,
        "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
        &internal_pubkey);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        internal_pubkey);
      CfdFreeStringBuffer(internal_pubkey);
      internal_pubkey = nullptr;
    }

    uint8_t leaf_version = 0;
    char* tapscript = nullptr;
    char* leaf_hash = nullptr;
    ret = CfdGetBaseTapLeaf(handle, tree_handle,
        &leaf_version, &tapscript, &leaf_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
        tapscript);
      EXPECT_STREQ(
        "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
        leaf_hash);
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
    }

    char* witness_program = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",
        witness_program);
      EXPECT_STREQ(
        "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
        leaf_hash);
      EXPECT_STREQ(
        "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}